

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_compilation.cpp
# Opt level: O0

maybe<pstore::repo::visibility,_void> __thiscall
pstore::exchange::import_ns::definition::decode_visibility(definition *this,string *visibility)

{
  bool bVar1;
  visibility local_1b [3];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  string *visibility_local;
  
  local_18 = visibility;
  visibility_local = (string *)this;
  bVar1 = std::operator==(visibility,"default");
  if (bVar1) {
    local_1b[2] = 0;
    just<pstore::repo::visibility>((pstore *)this,local_1b + 2);
  }
  else {
    bVar1 = std::operator==(local_18,"hidden");
    if (bVar1) {
      local_1b[1] = 1;
      just<pstore::repo::visibility>((pstore *)this,local_1b + 1);
    }
    else {
      bVar1 = std::operator==(local_18,"protected");
      if (bVar1) {
        local_1b[0] = protected_vis;
        just<pstore::repo::visibility>((pstore *)this,local_1b);
      }
      else {
        nothing<pstore::repo::visibility>();
      }
    }
  }
  return SUB82(this,0);
}

Assistant:

maybe<repo::visibility> definition::decode_visibility (std::string const & visibility) {
                if (visibility == "default") {
                    return just (repo::visibility::default_vis);
                }
                if (visibility == "hidden") {
                    return just (repo::visibility::hidden_vis);
                }
                if (visibility == "protected") {
                    return just (repo::visibility::protected_vis);
                }
                return nothing<repo::visibility> ();
            }